

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing_v2.cpp
# Opt level: O0

bool problem_with_file_to_read(ifstream *in_file,string *in_name)

{
  ulong uVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *in_name_local;
  ifstream *in_file_local;
  
  local_20 = in_name;
  in_name_local = (string *)in_file;
  uVar1 = std::ifstream::is_open();
  bVar2 = (uVar1 & 1) == 0;
  if (bVar2) {
    std::operator+(&local_60,"\n!! Problems reading from in_file \'",local_20);
    std::operator+(&local_40,&local_60,"\'. Aborting!\n");
    write_colored_text(&local_40,red);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return bVar2;
}

Assistant:

bool problem_with_file_to_read(ifstream &in_file, const string &in_name) {
    if (!in_file.is_open()) {
        write_colored_text("\n!! Problems reading from in_file '" + in_name + "'. Aborting!\n");
        return true;  // NOTE: closing of already opened files is not necessary, as they are closed when ifstream/ofstream are destroyed
    }
    return false;
}